

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

ROMImage * MT32Emu::ROMImage::makeFullROMImage(Bit8u *data,size_t dataSize)

{
  ROMImage *pRVar1;
  ArrayFile *this;
  ROMInfo *pRVar2;
  long lVar3;
  undefined **ppuVar4;
  undefined8 *puVar5;
  byte bVar6;
  
  bVar6 = 0;
  pRVar1 = (ROMImage *)operator_new(0x18);
  this = (ArrayFile *)operator_new(0x50);
  ArrayFile::ArrayFile(this,data,dataSize);
  if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
    getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
    getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
    getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
    getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
    getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
    getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
    ppuVar4 = &getROMInfoLists()::FULL_ROM_INFOS;
    puVar5 = &getROMInfoLists()::ALL_ROM_INFOS;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    ppuVar4 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
    puVar5 = &DAT_001d14f0;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
  }
  pRVar1->file = (File *)this;
  pRVar1->ownFile = true;
  pRVar2 = ROMInfo::getROMInfo((File *)this,(ROMInfo **)&getROMInfoLists()::ALL_ROM_INFOS);
  pRVar1->romInfo = pRVar2;
  return pRVar1;
}

Assistant:

const ROMImage *ROMImage::makeFullROMImage(Bit8u *data, size_t dataSize) {
	return new ROMImage(new ArrayFile(data, dataSize), true, getKnownROMInfoList());
}